

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::Parser::SkipStatement(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  int iVar3;
  
  do {
    TVar1 = (this->input_->current_).type;
    if (TVar1 == TYPE_SYMBOL) {
      bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
      if (bVar2) {
        return;
      }
      bVar2 = TryConsume(this,"{");
      if (bVar2) {
        SkipRestOfBlock(this);
        return;
      }
      iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar3 == 0) {
        return;
      }
    }
    else if (TVar1 == TYPE_END) {
      return;
    }
    io::Tokenizer::Next(this->input_);
  } while( true );
}

Assistant:

void Parser::SkipStatement() {
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration(";", NULL)) {
        return;
      } else if (TryConsume("{")) {
        SkipRestOfBlock();
        return;
      } else if (LookingAt("}")) {
        return;
      }
    }
    input_->Next();
  }
}